

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O2

uint crnlib::dxt1_block::get_block_colors4(color_quad_u8 *pDst,uint16 color0,uint16 color1)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  dxt1_block in_RAX;
  color_quad_u8 c1;
  color_quad_u8 c0;
  
  _c1 = in_RAX;
  unpack_color((dxt1_block *)&c0,color0,true,0xff);
  unpack_color((dxt1_block *)&c1,color1,true,0xff);
  (pDst->field_0).field_0 =
       (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0)
       c0;
  pDst[1].field_0.field_0 =
       (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0)
       c1.field_0;
  uVar2 = c1._5_2_ & 0xff;
  uVar1 = c1.field_0._1_2_ & 0xff;
  uVar4 = c1._6_2_ & 0xff;
  uVar3 = (ushort)c1.field_0._2_2_ & 0xff;
  pDst[2].field_0.field_0.r =
       (uchar)((((uint)c1.field_0 & 0xff) + ((uint)c0.field_0 & 0xff) * 2) / 3);
  pDst[2].field_0.field_0.g = (uchar)((ushort)(uVar1 + uVar2 * 2) / 3);
  pDst[2].field_0.field_0.b = (uchar)((ushort)(uVar3 + uVar4 * 2) / 3);
  pDst[2].field_0.field_0.a = 0xff;
  pDst[3].field_0.field_0.r =
       (uchar)((ushort)((short)((uint)c0.field_0 & 0xff) + (short)((uint)c1.field_0 & 0xff) * 2) / 3
              );
  pDst[3].field_0.field_0.g = (uchar)((ushort)(uVar2 + uVar1 * 2) / 3);
  pDst[3].field_0.field_0.b = (uchar)((ushort)(uVar4 + uVar3 * 2) / 3);
  pDst[3].field_0.field_0.a = 0xff;
  return 4;
}

Assistant:

uint dxt1_block::get_block_colors4(color_quad_u8* pDst, uint16 color0, uint16 color1)
    {
        color_quad_u8 c0(unpack_color(color0, true));
        color_quad_u8 c1(unpack_color(color1, true));

        pDst[0] = c0;
        pDst[1] = c1;

        // The compiler changes the div3 into a mul by recip+shift.
        pDst[2].set_noclamp_rgba((c0.r * 2 + c1.r) / 3, (c0.g * 2 + c1.g) / 3, (c0.b * 2 + c1.b) / 3, 255U);
        pDst[3].set_noclamp_rgba((c1.r * 2 + c0.r) / 3, (c1.g * 2 + c0.g) / 3, (c1.b * 2 + c0.b) / 3, 255U);

        return 4;
    }